

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PendingTermsAdd(Fts3Table *p,int iLangid,char *zText,int iCol,u32 *pnWord)

{
  sqlite3_tokenizer *psVar1;
  Fts3Index *pFVar2;
  bool bVar3;
  int local_98;
  Fts3Index *pIndex;
  int i;
  _func_int_sqlite3_tokenizer_cursor_ptr_char_ptr_ptr_int_ptr_int_ptr_int_ptr_int_ptr *xNext;
  sqlite3_tokenizer_cursor *pCsr;
  sqlite3_tokenizer_module *pModule;
  sqlite3_tokenizer *pTokenizer;
  char *pcStack_58;
  int nToken;
  char *zToken;
  int local_48;
  int nWord;
  int iPos;
  int iEnd;
  int iStart;
  int rc;
  u32 *pnWord_local;
  char *pcStack_28;
  int iCol_local;
  char *zText_local;
  Fts3Table *pFStack_18;
  int iLangid_local;
  Fts3Table *p_local;
  
  iPos = 0;
  nWord = 0;
  local_48 = 0;
  zToken._4_4_ = 0;
  pTokenizer._4_4_ = 0;
  pModule = (sqlite3_tokenizer_module *)p->pTokenizer;
  pCsr = *(sqlite3_tokenizer_cursor **)pModule;
  if (zText == (char *)0x0) {
    *pnWord = 0;
    p_local._4_4_ = 0;
  }
  else {
    _iStart = pnWord;
    pnWord_local._4_4_ = iCol;
    pcStack_28 = zText;
    zText_local._4_4_ = iLangid;
    pFStack_18 = p;
    iEnd = sqlite3Fts3OpenTokenizer
                     ((sqlite3_tokenizer *)pModule,iLangid,zText,-1,
                      (sqlite3_tokenizer_cursor **)&xNext);
    p_local._4_4_ = iEnd;
    if (iEnd == 0) {
      psVar1 = pCsr[5].pTokenizer;
      while( true ) {
        bVar3 = false;
        if (iEnd == 0) {
          iEnd = (*(code *)psVar1)(xNext,&stack0xffffffffffffffa8,(long)&pTokenizer + 4,&iPos,&nWord
                                   ,&local_48);
          bVar3 = iEnd == 0;
        }
        if (!bVar3) goto LAB_00206b56;
        if (zToken._4_4_ <= local_48) {
          zToken._4_4_ = local_48 + 1;
        }
        if (((local_48 < 0) || (pcStack_58 == (char *)0x0)) || (pTokenizer._4_4_ < 1)) break;
        iEnd = fts3PendingTermsAddOne
                         (pFStack_18,pnWord_local._4_4_,local_48,&pFStack_18->aIndex->hPending,
                          pcStack_58,pTokenizer._4_4_);
        pIndex._4_4_ = 1;
        while( true ) {
          bVar3 = false;
          if (iEnd == 0) {
            bVar3 = pIndex._4_4_ < pFStack_18->nIndex;
          }
          if (!bVar3) break;
          pFVar2 = pFStack_18->aIndex + pIndex._4_4_;
          if (pFVar2->nPrefix <= pTokenizer._4_4_) {
            iEnd = fts3PendingTermsAddOne
                             (pFStack_18,pnWord_local._4_4_,local_48,&pFVar2->hPending,pcStack_58,
                              pFVar2->nPrefix);
          }
          pIndex._4_4_ = pIndex._4_4_ + 1;
        }
      }
      iEnd = 1;
LAB_00206b56:
      (*(code *)pCsr[4].pTokenizer)(xNext);
      *_iStart = zToken._4_4_ + *_iStart;
      if (iEnd == 0x65) {
        local_98 = 0;
      }
      else {
        local_98 = iEnd;
      }
      p_local._4_4_ = local_98;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int fts3PendingTermsAdd(
  Fts3Table *p,                   /* Table into which text will be inserted */
  int iLangid,                    /* Language id to use */
  const char *zText,              /* Text of document to be inserted */
  int iCol,                       /* Column into which text is being inserted */
  u32 *pnWord                     /* IN/OUT: Incr. by number tokens inserted */
){
  int rc;
  int iStart = 0;
  int iEnd = 0;
  int iPos = 0;
  int nWord = 0;

  char const *zToken;
  int nToken = 0;

  sqlite3_tokenizer *pTokenizer = p->pTokenizer;
  sqlite3_tokenizer_module const *pModule = pTokenizer->pModule;
  sqlite3_tokenizer_cursor *pCsr;
  int (*xNext)(sqlite3_tokenizer_cursor *pCursor,
      const char**,int*,int*,int*,int*);

  assert( pTokenizer && pModule );

  /* If the user has inserted a NULL value, this function may be called with
  ** zText==0. In this case, add zero token entries to the hash table and 
  ** return early. */
  if( zText==0 ){
    *pnWord = 0;
    return SQLITE_OK;
  }

  rc = sqlite3Fts3OpenTokenizer(pTokenizer, iLangid, zText, -1, &pCsr);
  if( rc!=SQLITE_OK ){
    return rc;
  }

  xNext = pModule->xNext;
  while( SQLITE_OK==rc
      && SQLITE_OK==(rc = xNext(pCsr, &zToken, &nToken, &iStart, &iEnd, &iPos))
  ){
    int i;
    if( iPos>=nWord ) nWord = iPos+1;

    /* Positions cannot be negative; we use -1 as a terminator internally.
    ** Tokens must have a non-zero length.
    */
    if( iPos<0 || !zToken || nToken<=0 ){
      rc = SQLITE_ERROR;
      break;
    }

    /* Add the term to the terms index */
    rc = fts3PendingTermsAddOne(
        p, iCol, iPos, &p->aIndex[0].hPending, zToken, nToken
    );
    
    /* Add the term to each of the prefix indexes that it is not too 
    ** short for. */
    for(i=1; rc==SQLITE_OK && i<p->nIndex; i++){
      struct Fts3Index *pIndex = &p->aIndex[i];
      if( nToken<pIndex->nPrefix ) continue;
      rc = fts3PendingTermsAddOne(
          p, iCol, iPos, &pIndex->hPending, zToken, pIndex->nPrefix
      );
    }
  }

  pModule->xClose(pCsr);
  *pnWord += nWord;
  return (rc==SQLITE_DONE ? SQLITE_OK : rc);
}